

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::BeginPopupModal(char *name,bool *p_open,ImGuiWindowFlags extra_flags)

{
  int iVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiID id;
  ImGuiContext *g;
  ImVec2 local_28;
  
  id = ImGuiWindow::GetID(GImGui->CurrentWindow,name,(char *)0x0);
  iVar1 = (GImGui->CurrentPopupStack).Size;
  if ((iVar1 < (GImGui->OpenPopupStack).Size) &&
     ((GImGui->OpenPopupStack).Data[iVar1].PopupId == id)) {
    local_28.x = 0.0;
    local_28.y = 0.0;
    bVar3 = Begin(name,p_open,&local_28,-1.0,extra_flags | 0x6000120);
    if (bVar3) {
      if (p_open == (bool *)0x0) {
        return true;
      }
      if (*p_open != false) {
        return true;
      }
      EndPopup();
      ClosePopup(id);
    }
    else {
      EndPopup();
    }
  }
  else {
    pIVar2 = GImGui;
    pIVar2->SetNextWindowSizeConstraint = false;
    pIVar2->SetNextWindowFocus = false;
    pIVar2->SetNextWindowPosCond = 0;
    pIVar2->SetNextWindowSizeCond = 0;
    pIVar2->SetNextWindowContentSizeCond = 0;
    pIVar2->SetNextWindowCollapsedCond = 0;
  }
  return false;
}

Assistant:

bool ImGui::BeginPopupModal(const char* name, bool* p_open, ImGuiWindowFlags extra_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiID id = window->GetID(name);
    if (!IsPopupOpen(id))
    {
        ClearSetNextWindowData(); // We behave like Begin() and need to consume those values
        return false;
    }

    ImGuiWindowFlags flags = extra_flags|ImGuiWindowFlags_Popup|ImGuiWindowFlags_Modal|ImGuiWindowFlags_NoCollapse|ImGuiWindowFlags_NoSavedSettings;
    bool is_open = ImGui::Begin(name, p_open, flags);
    if (!is_open || (p_open && !*p_open)) // NB: is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    {
        ImGui::EndPopup();
        if (is_open)
            ClosePopup(id);
        return false;
    }

    return is_open;
}